

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCompare(Parse *pParse,Expr *pA,Expr *pB,int iTab)

{
  u32 *puVar1;
  short sVar2;
  char *zLeft;
  sqlite3_value *v;
  u8 uVar3;
  int iVar4;
  uint uVar5;
  sqlite3_value *pVal;
  u8 uVar6;
  u8 aff;
  uint uVar7;
  sqlite3_value *local_38;
  
  if (pA == (Expr *)0x0 || pB == (Expr *)0x0) {
    return (uint)(pB != pA) * 2;
  }
  if ((pParse != (Parse *)0x0) && (pA->op == 0x9c)) {
    local_38 = (Mem *)0x0;
    sqlite3ValueFromExpr(pParse->db,pB,'\x01','A',&local_38);
    v = local_38;
    if (local_38 != (Mem *)0x0) {
      sVar2 = pA->iColumn;
      uVar7 = 0x80000000;
      if (sVar2 < 0x20) {
        uVar7 = 1 << ((char)sVar2 - 1U & 0x1f);
      }
      puVar1 = &pParse->pVdbe->expmask;
      *puVar1 = *puVar1 | uVar7;
      pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar2,aff);
      if (pVal == (sqlite3_value *)0x0) {
        sqlite3ValueFree(v);
        sqlite3ValueFree((sqlite3_value *)0x0);
      }
      else {
        uVar7._0_2_ = pVal->flags;
        uVar7._2_1_ = pVal->enc;
        uVar7._3_1_ = pVal->eSubtype;
        if ((0x4000000040004U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
          sqlite3_value_text(pVal);
        }
        iVar4 = sqlite3MemCompare(pVal,v,(CollSeq *)0x0);
        sqlite3ValueFree(v);
        sqlite3ValueFree(pVal);
        if (iVar4 == 0) {
          return 0;
        }
      }
    }
  }
  uVar7 = pB->flags | pA->flags;
  if ((uVar7 >> 0xb & 1) != 0) {
    if (((pA->flags & pB->flags) >> 0xb & 1) == 0) {
      return 2;
    }
    if ((pA->u).iValue == (pB->u).iValue) {
      return 0;
    }
    return 2;
  }
  uVar3 = pA->op;
  uVar6 = pB->op;
  if (uVar3 == 'G' || uVar3 != uVar6) {
    if (uVar3 == 'q') {
      uVar5 = sqlite3ExprCompare(pParse,pA->pLeft,pB,iTab);
      if (uVar5 < 2) {
        return 1;
      }
      uVar6 = pB->op;
    }
    if ((uVar6 == 'q') && (uVar5 = sqlite3ExprCompare(pParse,pA,pB->pLeft,iTab), uVar5 < 2)) {
      return 1;
    }
    if (pA->op != 0xa9) {
      return 2;
    }
    if (pB->op != 0xa7) {
      return 2;
    }
    if (-1 < pB->iTable) {
      return 2;
    }
    uVar3 = 0xa9;
    if (pA->iTable != iTab) {
      return 2;
    }
  }
  zLeft = (pA->u).zToken;
  if (zLeft == (char *)0x0) goto LAB_0017080e;
  if (uVar3 == 'q') {
    iVar4 = sqlite3_stricmp(zLeft,(pB->u).zToken);
  }
  else {
    if (uVar3 == 'y') {
      return 0;
    }
    if ((uVar3 == 0xac) || (uVar3 == 0xa8)) {
      iVar4 = sqlite3StrICmp(zLeft,(pB->u).zToken);
      if (iVar4 != 0) {
        return 2;
      }
      uVar5 = pA->flags & 0x1000000;
      if (uVar5 >> 0x18 != (uint)((pB->flags >> 0x18 & 1) != 0)) {
        return 2;
      }
      if ((uVar5 != 0) &&
         (iVar4 = sqlite3WindowCompare(pParse,(pA->y).pWin,(pB->y).pWin,1), iVar4 != 0)) {
        return 2;
      }
      goto LAB_0017080e;
    }
    if ((((pB->u).zToken == (char *)0x0) || (uVar3 == 0xa7)) || (uVar3 == 0xa9)) goto LAB_0017080e;
    iVar4 = strcmp(zLeft,(pB->u).zToken);
  }
  if (iVar4 != 0) {
    return 2;
  }
LAB_0017080e:
  if (((pB->flags ^ pA->flags) & 0x404) != 0) {
    return 2;
  }
  if ((uVar7 >> 0x10 & 1) == 0) {
    if ((uVar7 >> 0xc & 1) != 0) {
      return 2;
    }
    if (((uVar7 & 0x20) == 0) &&
       (iVar4 = sqlite3ExprCompare(pParse,pA->pLeft,pB->pLeft,iTab), iVar4 != 0)) {
      return 2;
    }
    iVar4 = sqlite3ExprCompare(pParse,pA->pRight,pB->pRight,iTab);
    if (iVar4 != 0) {
      return 2;
    }
    iVar4 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
    if (iVar4 != 0) {
      return 2;
    }
    uVar3 = pA->op;
    if (((uVar3 != 'u') && (uVar3 != 0xaa)) && ((uVar7 >> 0xe & 1) == 0)) {
      if (pA->iColumn != pB->iColumn) {
        return 2;
      }
      if ((uVar3 == 0xaf) && (pA->op2 != pB->op2)) {
        return 2;
      }
      if (((uVar3 != '1') && (pA->iTable != iTab)) && (pA->iTable != pB->iTable)) {
        return 2;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(
  const Parse *pParse,
  const Expr *pA,
  const Expr *pB,
  int iTab
){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  if( pParse && pA->op==TK_VARIABLE && exprCompareVariable(pParse, pA, pB) ){
    return 0;
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op || pA->op==TK_RAISE ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA->pLeft,pB,iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA,pB->pLeft,iTab)<2 ){
      return 1;
    }
    if( pA->op==TK_AGG_COLUMN && pB->op==TK_COLUMN
     && pB->iTable<0 && pA->iTable==iTab
    ){
      /* fall through */
    }else{
      return 2;
    }
  }
  assert( !ExprHasProperty(pA, EP_IntValue) );
  assert( !ExprHasProperty(pB, EP_IntValue) );
  if( pA->u.zToken ){
    if( pA->op==TK_FUNCTION || pA->op==TK_AGG_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
#ifndef SQLITE_OMIT_WINDOWFUNC
      assert( pA->op==pB->op );
      if( ExprHasProperty(pA,EP_WinFunc)!=ExprHasProperty(pB,EP_WinFunc) ){
        return 2;
      }
      if( ExprHasProperty(pA,EP_WinFunc) ){
        if( sqlite3WindowCompare(pParse, pA->y.pWin, pB->y.pWin, 1)!=0 ){
          return 2;
        }
      }
#endif
    }else if( pA->op==TK_NULL ){
      return 0;
    }else if( pA->op==TK_COLLATE ){
      if( sqlite3_stricmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else
    if( pB->u.zToken!=0
     && pA->op!=TK_COLUMN
     && pA->op!=TK_AGG_COLUMN
     && strcmp(pA->u.zToken,pB->u.zToken)!=0
    ){
      return 2;
    }
  }
  if( (pA->flags & (EP_Distinct|EP_Commuted))
     != (pB->flags & (EP_Distinct|EP_Commuted)) ) return 2;
  if( ALWAYS((combinedFlags & EP_TokenOnly)==0) ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( (combinedFlags & EP_FixedCol)==0
     && sqlite3ExprCompare(pParse, pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( pA->op!=TK_STRING
     && pA->op!=TK_TRUEFALSE
     && ALWAYS((combinedFlags & EP_Reduced)==0)
    ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->op2!=pB->op2 && pA->op==TK_TRUTH ) return 2;
      if( pA->op!=TK_IN && pA->iTable!=pB->iTable && pA->iTable!=iTab ){
        return 2;
      }
    }
  }
  return 0;
}